

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::remap_compute_pipeline_ci
          (Impl *this,VkComputePipelineCreateInfo *info)

{
  bool bVar1;
  VkComputePipelineCreateInfo *info_local;
  Impl *this_local;
  
  bVar1 = remap_shader_module_handle(this,&info->stage);
  if (bVar1) {
    if ((info->basePipelineHandle == (VkPipeline)0x0) ||
       (bVar1 = remap_compute_pipeline_handle
                          (this,info->basePipelineHandle,&info->basePipelineHandle), bVar1)) {
      bVar1 = remap_pipeline_layout_handle(this,info->layout,&info->layout);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::remap_compute_pipeline_ci(VkComputePipelineCreateInfo *info)
{
	if (!remap_shader_module_handle(info->stage))
		return false;

	if (info->basePipelineHandle != VK_NULL_HANDLE)
		if (!remap_compute_pipeline_handle(info->basePipelineHandle, &info->basePipelineHandle))
			return false;

	if (!remap_pipeline_layout_handle(info->layout, &info->layout))
		return false;

	return true;
}